

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cpp
# Opt level: O1

process_id lsvm::system::new_process(block *b)

{
  undefined8 *puVar1;
  message_frame *pmVar2;
  
  puVar1 = (undefined8 *)memory::allocate(0x28);
  processes_count = processes_count + 1;
  *(int *)(puVar1 + 2) = processes_count;
  *puVar1 = &processes;
  puVar1[1] = processes;
  pmVar2 = object::new_message_frame(b);
  puVar1[4] = pmVar2;
  *(undefined4 *)((long)puVar1 + 0x14) = 0;
  processes = puVar1;
  return *(process_id *)(puVar1 + 2);
}

Assistant:

process_id new_process(block* b){
    process* p = (process*)lsvm::memory::allocate(sizeof(process));
    p->id = ++processes_count;
    p->prev = &processes;
    p->next = processes;
    p->mf = lsvm::object::new_message_frame(b);
    p->status = RUNNING;
    processes = p;
    return p->id;
}